

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig fbconfig;
  int iVar1;
  uint uVar2;
  char *__s1;
  GLXFBConfig *pp_Var3;
  _GLFWfbconfig *alternatives;
  _GLFWfbconfig *p_Var4;
  size_t __nmemb;
  long lVar5;
  uint uVar6;
  bool bVar7;
  int nativeCount;
  GLXFBConfig *local_40;
  _GLFWfbconfig *local_38;
  
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if (__s1 == (char *)0x0) {
    bVar7 = true;
  }
  else {
    iVar1 = strcmp(__s1,"Chromium");
    bVar7 = iVar1 != 0;
  }
  pp_Var3 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&nativeCount);
  __nmemb = (size_t)nativeCount;
  if (__nmemb == 0) {
    uVar6 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    local_40 = result;
    local_38 = desired;
    alternatives = (_GLFWfbconfig *)calloc(__nmemb,0x48);
    uVar6 = 0;
    for (lVar5 = 0; lVar5 < (int)__nmemb; lVar5 = lVar5 + 1) {
      fbconfig = pp_Var3[lVar5];
      uVar2 = getGLXFBConfigAttrib(fbconfig,0x8011);
      if ((uVar2 & 1) != 0) {
        uVar2 = getGLXFBConfigAttrib(fbconfig,0x8010);
        if (!(bool)(bVar7 & (uVar2 & 1) == 0)) {
          p_Var4 = alternatives + (int)uVar6;
          iVar1 = getGLXFBConfigAttrib(fbconfig,8);
          p_Var4->redBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,9);
          p_Var4->greenBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,10);
          p_Var4->blueBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0xb);
          p_Var4->alphaBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0xc);
          p_Var4->depthBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0xd);
          p_Var4->stencilBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0xe);
          p_Var4->accumRedBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0xf);
          p_Var4->accumGreenBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0x10);
          p_Var4->accumBlueBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,0x11);
          p_Var4->accumAlphaBits = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,7);
          p_Var4->auxBuffers = iVar1;
          iVar1 = getGLXFBConfigAttrib(fbconfig,6);
          if (iVar1 != 0) {
            p_Var4->stereo = 1;
          }
          iVar1 = getGLXFBConfigAttrib(fbconfig,5);
          if (iVar1 != 0) {
            p_Var4->doublebuffer = 1;
          }
          if (_glfw.glx.ARB_multisample != 0) {
            iVar1 = getGLXFBConfigAttrib(fbconfig,0x186a1);
            p_Var4->samples = iVar1;
          }
          if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
            iVar1 = getGLXFBConfigAttrib(fbconfig,0x20b2);
            p_Var4->sRGB = iVar1;
          }
          p_Var4->handle = (uintptr_t)fbconfig;
          uVar6 = uVar6 + 1;
        }
      }
      __nmemb = (size_t)(uint)nativeCount;
    }
    p_Var4 = _glfwChooseFBConfig(local_38,alternatives,uVar6);
    if (p_Var4 != (_GLFWfbconfig *)0x0) {
      *local_40 = (GLXFBConfig)p_Var4->handle;
    }
    uVar6 = (uint)(p_Var4 != (_GLFWfbconfig *)0x0);
    XFree(pp_Var3);
    free(alternatives);
  }
  return uVar6;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired, GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;
        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER))
            u->doublebuffer = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}